

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

uint __thiscall llvm::APInt::countTrailingZerosSlowCase(APInt *this)

{
  uint uVar1;
  size_t sVar2;
  uint *puVar3;
  bool bVar4;
  uint local_18;
  uint local_14;
  uint i;
  uint Count;
  APInt *this_local;
  
  local_14 = 0;
  local_18 = 0;
  _i = this;
  while( true ) {
    uVar1 = getNumWords(this);
    bVar4 = false;
    if (local_18 < uVar1) {
      bVar4 = (this->U).pVal[local_18] == 0;
    }
    if (!bVar4) break;
    local_14 = local_14 + 0x40;
    local_18 = local_18 + 1;
  }
  uVar1 = getNumWords(this);
  if (local_18 < uVar1) {
    sVar2 = countTrailingZeros<unsigned_long>((this->U).pVal[local_18],ZB_Width);
    local_14 = local_14 + (int)sVar2;
  }
  puVar3 = std::min<unsigned_int>(&local_14,&this->BitWidth);
  return *puVar3;
}

Assistant:

unsigned APInt::countTrailingZerosSlowCase() const {
  unsigned Count = 0;
  unsigned i = 0;
  for (; i < getNumWords() && U.pVal[i] == 0; ++i)
    Count += APINT_BITS_PER_WORD;
  if (i < getNumWords())
    Count += llvm::countTrailingZeros(U.pVal[i]);
  return std::min(Count, BitWidth);
}